

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O2

void test_bhdct_get_lots(planck_unit_test_t *tc)

{
  uint uVar1;
  int iVar2;
  int local_a8;
  uint local_a4;
  int local_a0;
  uint local_9c;
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  
  bhdct_setup(tc,&handler,&dict,ion_fill_none);
  iVar2 = 0x5dc;
  for (uVar1 = 300; uVar1 < 1000; uVar1 = uVar1 + 0xf) {
    local_a0 = iVar2;
    local_9c = uVar1;
    bhdct_insert(tc,&dict,&local_9c,&local_a0,'\x01');
    iVar2 = iVar2 + 0x4b;
  }
  iVar2 = 0x5dc;
  for (uVar1 = 300; uVar1 < 1000; uVar1 = uVar1 + 0xf) {
    local_a8 = iVar2;
    local_a4 = uVar1;
    bhdct_get(tc,&dict,&local_a4,&local_a8,'\0',1);
    iVar2 = iVar2 + 0x4b;
  }
  bhdct_takedown(tc,&dict);
  return;
}

Assistant:

void
test_bhdct_get_lots(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;

	bhdct_setup(tc, &handler, &dict, ion_fill_none);

	int i;

	for (i = 300; i < 1000; i += 15) {
		bhdct_insert(tc, &dict, IONIZE(i, int), IONIZE(i * 5, int), boolean_true);
	}

	for (i = 300; i < 1000; i += 15) {
		bhdct_get(tc, &dict, IONIZE(i, int), IONIZE(i * 5, int), err_ok, 1);
	}

	bhdct_takedown(tc, &dict);
}